

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

bool __thiscall
ELFIO::elfio::write_segment_data
          (elfio *this,segment *seg,vector<bool,_std::allocator<bool>_> *section_generated,
          Elf_Xword *segment_memory,Elf_Xword *segment_filesize,Elf_Xword *seg_start_pos)

{
  Elf_Xword *pEVar1;
  elfio *peVar2;
  pointer puVar3;
  _Bit_type *p_Var4;
  char cVar5;
  short sVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong *puVar13;
  _Head_base<0UL,_ELFIO::section_*,_false> _Var14;
  ulong uVar15;
  ulong uVar16;
  ushort uVar17;
  long local_38;
  
  sVar6 = (**(code **)(*(long *)seg + 0xb0))(seg);
  if (sVar6 != 0) {
    pEVar1 = &this->current_file_pos;
    uVar17 = 0;
    do {
      uVar7 = (**(code **)(*(long *)seg + 0xb8))(seg,uVar17);
      peVar2 = (this->sections).parent;
      puVar3 = (peVar2->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar7 <
          (ulong)((long)(peVar2->sections_).
                        super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
        _Var14._M_head_impl =
             *(section **)
              &puVar3[uVar7]._M_t.
               super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>;
      }
      else {
        _Var14._M_head_impl = (section *)0x0;
      }
      iVar8 = (**(code **)(*(long *)_Var14._M_head_impl + 0x28))(_Var14._M_head_impl);
      uVar15 = 1L << ((byte)uVar7 & 0x3f);
      uVar7 = uVar7 >> 6;
      p_Var4 = (section_generated->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar16 = p_Var4[uVar7];
      if (iVar8 == 0) {
        puVar13 = p_Var4 + uVar7;
LAB_00107674:
        *puVar13 = uVar16 | uVar15;
      }
      else {
        if (((((uVar16 & uVar15) == 0) &&
             (cVar5 = (**(code **)(*(long *)_Var14._M_head_impl + 0x130))(_Var14._M_head_impl),
             cVar5 != '\0')) &&
            (iVar8 = (**(code **)(*(long *)_Var14._M_head_impl + 0x28))(_Var14._M_head_impl),
            iVar8 != 8)) &&
           ((iVar8 = (**(code **)(*(long *)_Var14._M_head_impl + 0x28))(_Var14._M_head_impl),
            iVar8 != 0 &&
            (lVar10 = (**(code **)(*(long *)_Var14._M_head_impl + 0x98))(_Var14._M_head_impl),
            lVar10 != 0)))) {
          lVar10 = (**(code **)(*(long *)_Var14._M_head_impl + 0x88))(_Var14._M_head_impl);
          lVar11 = (**(code **)(*(long *)seg + 0x48))(seg);
          uVar16 = (lVar10 - lVar11) - (*pEVar1 - *seg_start_pos);
          if ((ulong)(lVar10 - lVar11) < *pEVar1 - *seg_start_pos) {
            return false;
          }
        }
        else if (((section_generated->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7] & uVar15)
                 == 0) {
          cVar5 = (**(code **)(*(long *)_Var14._M_head_impl + 0x130))(_Var14._M_head_impl);
          if (cVar5 == '\0') {
            lVar10 = (**(code **)(*(long *)_Var14._M_head_impl + 0x68))(_Var14._M_head_impl);
            uVar16 = lVar10 + (ulong)(lVar10 == 0);
            uVar16 = (uVar16 - *pEVar1 % uVar16) % uVar16;
          }
          else {
            if (((section_generated->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7] & uVar15) !=
                0) goto LAB_001074e2;
            uVar16 = 0;
          }
        }
        else {
LAB_001074e2:
          lVar10 = (**(code **)(*(long *)_Var14._M_head_impl + 0xb8))(_Var14._M_head_impl);
          uVar16 = lVar10 - (*seg_start_pos + *segment_filesize);
        }
        uVar12 = (**(code **)(*(long *)_Var14._M_head_impl + 0x38))(_Var14._M_head_impl);
        if (((uVar12 & 2) != 0) &&
           (((uVar9 = (**(code **)(*(long *)_Var14._M_head_impl + 0x38))(_Var14._M_head_impl),
             (uVar9 >> 10 & 1) == 0 || (iVar8 = (**(code **)(*(long *)seg + 0x18))(seg), iVar8 == 7)
             ) || (iVar8 = (**(code **)(*(long *)_Var14._M_head_impl + 0x28))(_Var14._M_head_impl),
                  iVar8 != 8)))) {
          lVar10 = (**(code **)(*(long *)_Var14._M_head_impl + 0x98))(_Var14._M_head_impl);
          *segment_memory = *segment_memory + lVar10 + uVar16;
        }
        iVar8 = (**(code **)(*(long *)_Var14._M_head_impl + 0x28))(_Var14._M_head_impl);
        if (iVar8 != 8) {
          lVar10 = (**(code **)(*(long *)_Var14._M_head_impl + 0x98))(_Var14._M_head_impl);
          *segment_filesize = *segment_filesize + lVar10 + uVar16;
        }
        if (((section_generated->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7] & uVar15) == 0)
        {
          *pEVar1 = *pEVar1 + uVar16;
          cVar5 = (**(code **)(*(long *)_Var14._M_head_impl + 0x130))(_Var14._M_head_impl);
          if (cVar5 == '\0') {
            lVar10 = (**(code **)(*(long *)seg + 0x48))(seg);
            local_38 = (lVar10 + *pEVar1) - *seg_start_pos;
            (**(code **)(*(long *)_Var14._M_head_impl + 0x90))(_Var14._M_head_impl,&local_38);
          }
          sVar6 = (**(code **)(*(long *)_Var14._M_head_impl + 0x10))(_Var14._M_head_impl);
          if (sVar6 != 0) {
            (**(code **)(*(long *)_Var14._M_head_impl + 0x110))(_Var14._M_head_impl,pEVar1);
          }
          iVar8 = (**(code **)(*(long *)_Var14._M_head_impl + 0x28))(_Var14._M_head_impl);
          if (iVar8 != 8) {
            lVar10 = (**(code **)(*(long *)_Var14._M_head_impl + 0x98))(_Var14._M_head_impl);
            *pEVar1 = *pEVar1 + lVar10;
          }
          puVar13 = (section_generated->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + uVar7;
          uVar16 = *puVar13;
          goto LAB_00107674;
        }
      }
      uVar17 = uVar17 + 1;
      uVar7 = (**(code **)(*(long *)seg + 0xb0))(seg);
    } while (uVar17 < uVar7);
  }
  return true;
}

Assistant:

bool write_segment_data( const segment*     seg,
                             std::vector<bool>& section_generated,
                             Elf_Xword&         segment_memory,
                             Elf_Xword&         segment_filesize,
                             const Elf_Xword&   seg_start_pos )
    {
        for ( Elf_Half j = 0; j < seg->get_sections_num(); ++j ) {
            Elf_Half index = seg->get_section_index_at( j );

            section* sec = sections[index];

            // The NULL section is always generated
            if ( SHT_NULL == sec->get_type() ) {
                section_generated[index] = true;
                continue;
            }

            Elf_Xword section_align = 0;
            // Fix up the alignment
            if ( !section_generated[index] && sec->is_address_initialized() &&
                 SHT_NOBITS != sec->get_type() && SHT_NULL != sec->get_type() &&
                 0 != sec->get_size() ) {
                // Align the sections based on the virtual addresses
                // when possible (this is what matters for execution)
                Elf64_Off req_offset =
                    sec->get_address() - seg->get_virtual_address();
                Elf64_Off cur_offset = current_file_pos - seg_start_pos;
                if ( req_offset < cur_offset ) {
                    // something has gone awfully wrong, abort!
                    // section_align would turn out negative, seeking backwards and overwriting previous data
                    return false;
                }
                section_align = req_offset - cur_offset;
            }
            else if ( !section_generated[index] &&
                      !sec->is_address_initialized() ) {
                // If no address has been specified then only the section
                // alignment constraint has to be matched
                Elf_Xword align = sec->get_addr_align();
                if ( align == 0 ) {
                    align = 1;
                }
                Elf64_Off error = current_file_pos % align;
                section_align   = ( align - error ) % align;
            }
            else if ( section_generated[index] ) {
                // Alignment for already generated sections
                section_align =
                    sec->get_offset() - seg_start_pos - segment_filesize;
            }

            // Determine the segment file and memory sizes
            // Special case .tbss section (NOBITS) in non TLS segment
            if ( ( ( sec->get_flags() & SHF_ALLOC ) == SHF_ALLOC ) &&
                 !( ( ( sec->get_flags() & SHF_TLS ) == SHF_TLS ) &&
                    ( seg->get_type() != PT_TLS ) &&
                    ( SHT_NOBITS == sec->get_type() ) ) ) {
                segment_memory += sec->get_size() + section_align;
            }

            if ( SHT_NOBITS != sec->get_type() ) {
                segment_filesize += sec->get_size() + section_align;
            }

            // Nothing to be done when generating nested segments
            if ( section_generated[index] ) {
                continue;
            }

            current_file_pos += section_align;

            // Set the section addresses when missing
            if ( !sec->is_address_initialized() ) {
                sec->set_address( seg->get_virtual_address() +
                                  current_file_pos - seg_start_pos );
            }

            if ( 0 != sec->get_index() ) {
                sec->set_offset( current_file_pos );
            }

            if ( SHT_NOBITS != sec->get_type() ) {
                current_file_pos += sec->get_size();
            }

            section_generated[index] = true;
        }

        return true;
    }